

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

bool __thiscall Bitvec16x16::AnyLessThan(Bitvec16x16 *this,Bitvec16x16 *other)

{
  undefined8 uVar1;
  Bitvec16x16 *other_local;
  Bitvec16x16 *this_local;
  
  uVar1 = vpcmpgtw_avx512vl(*(undefined1 (*) [32])other->vec,*(undefined1 (*) [32])this->vec);
  return (int)uVar1 != 0;
}

Assistant:

inline bool AnyLessThan(const Bitvec16x16 &other) const {
#if(defined __AVX512VL__ && defined __AVX512BW__)
        return _mm256_cmp_epi16_mask(vec, other.vec, _MM_CMPINT_LT) != 0;
#else
        Bitvec16x16 which_less_than = _mm256_cmpgt_epi16(other.vec, vec);
        return _mm256_movemask_epi8(which_less_than.vec) != 0;
#endif
    }